

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.hpp
# Opt level: O0

void __thiscall henson::Scheduler::finish(Scheduler *this)

{
  bool bVar1;
  logger *in_RDI;
  Scheduler *unaff_retaddr;
  Scheduler *in_stack_00000028;
  Scheduler *in_stack_000001a0;
  char (*in_stack_ffffffffffffffe8) [31];
  
  std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x31495f);
  spdlog::logger::debug<char[31]>(in_RDI,in_stack_ffffffffffffffe8);
  while( true ) {
    bVar1 = unfinished_jobs((Scheduler *)0x314978);
    if (!bVar1) break;
    check_for_complete_jobs(in_stack_000001a0);
  }
  log_job_times(in_stack_00000028);
  signal_stop(unaff_retaddr);
  return;
}

Assistant:

void    finish()
        {
            log_->debug("Finishing scheduler controller");
            while (unfinished_jobs())
                check_for_complete_jobs();

            log_job_times();
            signal_stop();
        }